

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

path * __thiscall boost::filesystem::path::relative_path(path *__return_storage_ptr__,path *this)

{
  path *ppVar1;
  path *ppVar2;
  value_type *pvVar3;
  long lVar4;
  bool local_71;
  undefined1 local_48 [8];
  iterator itr;
  path *this_local;
  
  itr.m_pos = (size_type)this;
  begin((iterator *)local_48,this);
  while( true ) {
    ppVar1 = itr.m_path_ptr;
    ppVar2 = (path *)std::__cxx11::string::size();
    local_71 = false;
    if (ppVar1 != ppVar2) {
      pvVar3 = (value_type *)std::__cxx11::string::operator[]((ulong)local_48);
      local_71 = anon_unknown.dwarf_f716::is_separator(*pvVar3);
    }
    if (local_71 == false) break;
    iterators::detail::
    iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                  *)local_48);
  }
  lVar4 = std::__cxx11::string::c_str();
  path(__return_storage_ptr__,(value_type *)(&((itr.m_path_ptr)->m_pathname)._M_dataplus + lVar4));
  iterator::~iterator((iterator *)local_48);
  return __return_storage_ptr__;
}

Assistant:

path path::relative_path() const
  {
    iterator itr(begin());

    for (; itr.m_pos != m_pathname.size()
      && (is_separator(itr.m_element.m_pathname[0])
#     ifdef BOOST_WINDOWS_API
      || itr.m_element.m_pathname[itr.m_element.m_pathname.size()-1] == colon
#     endif
    ); ++itr) {}

    return path(m_pathname.c_str() + itr.m_pos);
  }